

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinitionUtil.cpp
# Opt level: O1

int deqp::gles31::Functional::anon_unknown_3::getNumTypeInstances
              (Shader *shader,Storage storage,_func_bool_DataType *predicate)

{
  uint uVar1;
  int iVar2;
  pointer pIVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  pointer pVVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  InstanceCounter local_40;
  long local_38;
  
  pIVar3 = (shader->m_defaultBlock).interfaceBlocks.
           super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_40.m_predicate = predicate;
  if ((int)((ulong)((long)(shader->m_defaultBlock).interfaceBlocks.
                          super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar3) >> 4) *
      0x38e38e39 < 1) {
    iVar7 = 0;
  }
  else {
    lVar5 = 0;
    iVar7 = 0;
    do {
      local_38 = lVar5;
      if (pIVar3[lVar5].storage == storage) {
        lVar10 = *(long *)&pIVar3[lVar5].dimensions.super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data;
        uVar1 = (uint)((ulong)((long)*(pointer *)
                                      ((long)&pIVar3[lVar5].dimensions.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl
                                      + 8) - lVar10) >> 2);
        if ((int)uVar1 < 1) {
          iVar6 = 1;
        }
        else {
          iVar6 = 1;
          uVar4 = 0;
          do {
            iVar6 = iVar6 * *(int *)(lVar10 + uVar4 * 4);
            uVar4 = uVar4 + 1;
          } while ((uVar1 & 0x7fffffff) != uVar4);
        }
        pIVar3 = (shader->m_defaultBlock).interfaceBlocks.
                 super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        lVar10 = *(long *)&pIVar3[lVar5].variables.
                           super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                           ._M_impl.super__Vector_impl_data;
        if (0 < (int)((ulong)((long)*(pointer *)
                                     ((long)&pIVar3[lVar5].variables.
                                             super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                                             ._M_impl + 8) - lVar10) >> 5) * -0x55555555) {
          lVar11 = 0x20;
          lVar9 = 0;
          do {
            iVar2 = accumulateComplexType<deqp::gles31::Functional::(anonymous_namespace)::InstanceCounter>
                              ((VarType *)(lVar10 + lVar11),&local_40);
            iVar7 = iVar7 + iVar2 * iVar6;
            lVar9 = lVar9 + 1;
            pIVar3 = (shader->m_defaultBlock).interfaceBlocks.
                     super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            lVar10 = *(long *)&pIVar3[lVar5].variables.
                               super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                               ._M_impl.super__Vector_impl_data;
            lVar11 = lVar11 + 0x60;
          } while (lVar9 < (int)((ulong)((long)*(pointer *)
                                                ((long)&pIVar3[lVar5].variables.
                                                                                                                
                                                  super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                                                  ._M_impl + 8) - lVar10) >> 5) * -0x55555555);
        }
      }
      lVar5 = local_38 + 1;
      pIVar3 = (shader->m_defaultBlock).interfaceBlocks.
               super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>._M_impl
               .super__Vector_impl_data._M_start;
    } while (lVar5 < (int)((ulong)((long)(shader->m_defaultBlock).interfaceBlocks.
                                         super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar3)
                          >> 4) * 0x38e38e39);
  }
  pVVar8 = (shader->m_defaultBlock).variables.
           super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(shader->m_defaultBlock).variables.
                              super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar8) >> 5) *
          -0x55555555) {
    lVar5 = 0x20;
    lVar10 = 0;
    do {
      if (*(Storage *)((long)pVVar8 + lVar5 + -8) == storage) {
        iVar6 = accumulateComplexType<deqp::gles31::Functional::(anonymous_namespace)::InstanceCounter>
                          ((VarType *)((long)&(pVVar8->layout).location + lVar5),&local_40);
        iVar7 = iVar7 + iVar6;
      }
      lVar10 = lVar10 + 1;
      pVVar8 = (shader->m_defaultBlock).variables.
               super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x60;
    } while (lVar10 < (int)((ulong)((long)(shader->m_defaultBlock).variables.
                                          super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar8)
                           >> 5) * -0x55555555);
  }
  return iVar7;
}

Assistant:

static int getNumTypeInstances (const ProgramInterfaceDefinition::Shader* shader, glu::Storage storage, bool (*predicate)(glu::DataType))
{
	return accumulateShader(shader, InterfaceBlockStorageFilter(storage), VariableDeclarationStorageFilter(storage), InstanceCounter(predicate));
}